

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::DumpFunctionId(FunctionBody *this,bool pad)

{
  uint uVar1;
  SourceContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  pSVar2 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr;
  uVar1 = pSVar2->sourceContextId;
  if (uVar1 == 0xffffffff) {
    if ((pSVar2->dwHostSourceContext == 0xffffffffffffffff) ||
       ((pSVar2->isHostDynamicDocument & 1U) != 0)) {
      pcVar6 = L"Dy.%-3d";
      pcVar7 = L"Dyn#%d";
    }
    else {
      pcVar6 = L"%-5d";
      pcVar7 = L"#%d";
    }
    if (pad) {
      pcVar7 = pcVar6;
    }
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0077245f;
      *puVar5 = 0;
    }
    Output::Print(pcVar7,(ulong)((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
    return;
  }
  pcVar7 = L"#%d.%d";
  if (pad) {
    pcVar7 = L"%2d.%-3d";
  }
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_0077245f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  Output::Print(pcVar7,(ulong)uVar1,
                (ulong)((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                       functionId);
  return;
}

Assistant:

void FunctionBody::DumpFunctionId(bool pad)
    {
        uint sourceContextId = this->GetSourceContextInfo()->sourceContextId;
        if (sourceContextId == Js::Constants::NoSourceContext)
        {
            if (this->IsDynamicScript())
            {
                Output::Print(pad? _u("Dy.%-3d") : _u("Dyn#%d"), this->GetLocalFunctionId());
            }
            else
            {
                // Function from LoadFile
                Output::Print(pad? _u("%-5d") : _u("#%d"), this->GetLocalFunctionId());
            }
        }
        else
        {
            Output::Print(pad? _u("%2d.%-3d") : _u("#%d.%d"), sourceContextId, this->GetLocalFunctionId());
        }
    }